

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O2

void br_aes_ct64_ortho(uint64_t *q)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar1 = (*q & 0x5555555555555555) + (q[1] & 0xd555555555555555) * 2;
  uVar9 = q[1] & 0xaaaaaaaaaaaaaaaa | *q >> 1 & 0x5555555555555555;
  uVar2 = (q[2] & 0x5555555555555555) + (q[3] & 0xd555555555555555) * 2;
  uVar5 = q[3] & 0xaaaaaaaaaaaaaaaa | q[2] >> 1 & 0x5555555555555555;
  uVar3 = (q[4] & 0x5555555555555555) + (q[5] & 0xd555555555555555) * 2;
  uVar10 = q[5] & 0xaaaaaaaaaaaaaaaa | q[4] >> 1 & 0x5555555555555555;
  uVar8 = (q[6] & 0x5555555555555555) + (q[7] & 0xd555555555555555) * 2;
  uVar7 = q[7] & 0xaaaaaaaaaaaaaaaa | q[6] >> 1 & 0x5555555555555555;
  uVar4 = (uVar1 & 0x3333333333333333) + (uVar2 & 0xf333333333333333) * 4;
  uVar6 = uVar2 & 0xcccccccccccccccc | uVar1 >> 2 & 0x3333333333333333;
  uVar1 = (uVar9 & 0x3333333333333333) + (uVar5 & 0xf333333333333333) * 4;
  uVar5 = uVar5 & 0xcccccccccccccccc | uVar9 >> 2 & 0x3333333333333333;
  uVar2 = (uVar3 & 0x3333333333333333) + (uVar8 & 0xf333333333333333) * 4;
  uVar9 = uVar8 & 0xcccccccccccccccc | uVar3 >> 2 & 0x3333333333333333;
  uVar3 = (uVar10 & 0x3333333333333333) + (uVar7 & 0xf333333333333333) * 4;
  uVar8 = uVar7 & 0xcccccccccccccccc | uVar10 >> 2 & 0x3333333333333333;
  *q = (uVar2 & 0xf0f0f0f0f0f0f0f) << 4 | uVar4 & 0xf0f0f0f0f0f0f0f;
  q[4] = uVar2 & 0xf0f0f0f0f0f0f0f0 | uVar4 >> 4 & 0xf0f0f0f0f0f0f0f;
  q[1] = (uVar3 & 0xf0f0f0f0f0f0f0f) << 4 | uVar1 & 0xf0f0f0f0f0f0f0f;
  q[5] = uVar3 & 0xf0f0f0f0f0f0f0f0 | uVar1 >> 4 & 0xf0f0f0f0f0f0f0f;
  q[2] = (uVar9 & 0xf0f0f0f0f0f0f0f) << 4 | uVar6 & 0xf0f0f0f0f0f0f0f;
  q[6] = uVar9 & 0xf0f0f0f0f0f0f0f0 | uVar6 >> 4 & 0xf0f0f0f0f0f0f0f;
  q[3] = (uVar8 & 0xf0f0f0f0f0f0f0f) << 4 | uVar5 & 0xf0f0f0f0f0f0f0f;
  q[7] = uVar8 & 0xf0f0f0f0f0f0f0f0 | uVar5 >> 4 & 0xf0f0f0f0f0f0f0f;
  return;
}

Assistant:

static void br_aes_ct64_ortho(uint64_t *q) {
#define SWAPN(cl, ch, s, x, y)   do { \
        uint64_t a, b; \
        a = (x); \
        b = (y); \
        (x) = (a & (uint64_t)(cl)) | ((b & (uint64_t)(cl)) << (s)); \
        (y) = ((a & (uint64_t)(ch)) >> (s)) | (b & (uint64_t)(ch)); \
    } while (0)

#define SWAP2(x, y)    SWAPN(0x5555555555555555, 0xAAAAAAAAAAAAAAAA,  1, x, y)
#define SWAP4(x, y)    SWAPN(0x3333333333333333, 0xCCCCCCCCCCCCCCCC,  2, x, y)
#define SWAP8(x, y)    SWAPN(0x0F0F0F0F0F0F0F0F, 0xF0F0F0F0F0F0F0F0,  4, x, y)

    SWAP2(q[0], q[1]);
    SWAP2(q[2], q[3]);
    SWAP2(q[4], q[5]);
    SWAP2(q[6], q[7]);

    SWAP4(q[0], q[2]);
    SWAP4(q[1], q[3]);
    SWAP4(q[4], q[6]);
    SWAP4(q[5], q[7]);

    SWAP8(q[0], q[4]);
    SWAP8(q[1], q[5]);
    SWAP8(q[2], q[6]);
    SWAP8(q[3], q[7]);
}